

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_3chan_interleave(exr_decode_pipeline_t *decode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint8_t *puVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  void *pvVar9;
  void *pvVar10;
  ulong uVar11;
  uint8_t *puVar12;
  
  iVar1 = (decode->chunk).height;
  if (0 < iVar1) {
    peVar4 = decode->channels;
    uVar2 = peVar4->width;
    puVar5 = (peVar4->field_12).decode_to_ptr;
    iVar3 = peVar4->user_line_stride;
    pvVar7 = decode->unpacked_buffer;
    lVar8 = (long)(int)(uVar2 * 6);
    pvVar9 = (void *)((long)pvVar7 + (long)(int)uVar2 * 4);
    pvVar10 = (void *)((long)pvVar7 + (long)(int)uVar2 * 2);
    iVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar11 = 0;
        puVar12 = puVar5;
        do {
          *(undefined2 *)puVar12 = *(undefined2 *)((long)pvVar7 + uVar11 * 2);
          *(undefined2 *)(puVar12 + 2) = *(undefined2 *)((long)pvVar10 + uVar11 * 2);
          *(undefined2 *)(puVar12 + 4) = *(undefined2 *)((long)pvVar9 + uVar11 * 2);
          puVar12 = puVar12 + 6;
          uVar11 = uVar11 + 1;
        } while (uVar2 != uVar11);
      }
      pvVar7 = (void *)((long)pvVar7 + lVar8);
      puVar5 = puVar5 + iVar3;
      iVar6 = iVar6 + 1;
      pvVar9 = (void *)((long)pvVar9 + lVar8);
      pvVar10 = (void *)((long)pvVar10 + lVar8);
    } while (iVar6 != iVar1);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan_interleave (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t*        out0;
    int             w, h;
    int             linc0;

    w     = decode->channels[0].width;
    h     = decode->chunk.height;
    linc0 = decode->channels[0].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;

    /* interleaving case, we can do this! */
    for (int y = 0; y < h; ++y)
    {
        uint16_t* out = (uint16_t*) out0;

        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;

        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
        {
            out[0] = one_to_native16 (in0[x]);
            out[1] = one_to_native16 (in1[x]);
            out[2] = one_to_native16 (in2[x]);
            out += 3;
        }
        out0 += linc0;
    }
    return EXR_ERR_SUCCESS;
}